

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_iterators.h
# Opt level: O2

void __thiscall
st_tree::detail::
d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>
::d1st_post_iterator
          (d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>
           *this,value_type *root)

{
  pointer pfVar1;
  node_type *pnVar2;
  frame local_58;
  
  this->_vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_002cd908;
  (this->_stack).
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stack).
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stack).
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (root != (value_type *)0x0) {
    local_58.second._base._M_node =
         (root->
         super_node_base<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_st_tree::detail::ptr_less<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>_>_>
         )._children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58._vptr_frame = (_func_int **)&PTR__frame_002cd938;
    local_58.second._vptr_valmap_iterator_adaptor_forward =
         (_func_int **)&PTR__valmap_iterator_adaptor_forward_002cd878;
    local_58.visited = false;
    local_58.first = root;
    std::
    vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame>>
    ::
    emplace_back<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame>
              ((vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame>>
                *)&this->_stack,&local_58);
    while( true ) {
      pfVar1 = (this->_stack).
               super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>::frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pnVar2 = pfVar1[-1].first;
      if ((pnVar2->
          super_node_base<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_st_tree::detail::ptr_less<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>_>_>
          )._children._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) break;
      local_58.first =
           (node_type *)
           (pnVar2->
           super_node_base<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_st_tree::detail::ptr_less<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>_>_>
           )._children._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      local_58.second._base._M_node =
           ((local_58.first)->
           super_node_base<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_st_tree::detail::ptr_less<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>_>_>
           )._children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_58._vptr_frame = (_func_int **)&PTR__frame_002cd938;
      local_58.second._vptr_valmap_iterator_adaptor_forward =
           (_func_int **)&PTR__valmap_iterator_adaptor_forward_002cd878;
      local_58.visited = false;
      std::
      vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame>>
      ::
      emplace_back<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame>
                ((vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>::frame>>
                  *)&this->_stack,&local_58);
    }
    pfVar1[-1].visited = true;
  }
  return;
}

Assistant:

d1st_post_iterator(value_type* root) {
        if (root == NULL) return;
        _stack.push_back(frame(const_cast<node_type*>(root), iterator(const_cast<node_type*>(root)->begin()), false));
        while (true) {
            if (_stack.back().first->empty()) {
                _stack.back().visited = true;
                break;
            }
            iterator b(_stack.back().first->begin());
            _stack.push_back(frame(&*b, iterator((b)->begin()), false));
        }
    }